

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testTerritory(char *alphaCode,Territory territory,int isAlias,int needsParent,Territory tcParent
                 )

{
  Territory TVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  char *local_68;
  char local_38 [4];
  int tn;
  char alphacode [8];
  uint i;
  char nam [8];
  int nrTests;
  Territory tcParent_local;
  int needsParent_local;
  int isAlias_local;
  Territory territory_local;
  char *alphaCode_local;
  
  nam[0] = '\0';
  nam[1] = '\0';
  nam[2] = '\0';
  nam[3] = '\0';
  alphacode[0] = '\0';
  alphacode[1] = '\0';
  alphacode[2] = '\0';
  alphacode[3] = '\0';
  for (; uVar3 = (ulong)(uint)alphacode._0_4_, sVar4 = strlen(alphaCode), uVar3 <= sVar4;
      alphacode._0_4_ = alphacode._0_4_ + 1) {
    strcpy(local_38,alphaCode);
    if ((needsParent == 0) && (alphacode._0_4_ == 0)) {
      TVar1 = getTerritoryCode(local_38,TERRITORY_NONE);
      nam._0_4_ = nam._0_4_ + 1;
      if (TVar1 != territory) {
        foundError();
        pcVar5 = getTerritoryIsoName(alphacode + 4,territory,0);
        printf("*** ERROR *** getTerritoryCode(\'%s\')=%d but expected %d (%s)\n",local_38,
               (ulong)(uint)TVar1,(ulong)(uint)territory,pcVar5);
      }
    }
    iVar2 = tolower((int)local_38[(uint)alphacode._0_4_]);
    local_38[(uint)alphacode._0_4_] = (char)iVar2;
    TVar1 = getTerritoryCode(local_38,tcParent);
    nam._0_4_ = nam._0_4_ + 1;
    if (TVar1 != territory) {
      foundError();
      if (tcParent == TERRITORY_UNKNOWN) {
        local_68 = "";
      }
      else {
        local_68 = getTerritoryIsoName(alphacode + 4,tcParent,0);
      }
      printf("*** ERROR *** getTerritoryCode(\'%s\',%s)=%d but expected %d\n",local_38,local_68,
             (ulong)(uint)TVar1,(ulong)(uint)territory);
    }
  }
  if ((_TERRITORY_MIN < tcParent) && (isAlias == 0)) {
    getTerritoryIsoName(alphacode + 4,territory,0);
    nam._0_4_ = nam._0_4_ + 1;
    iVar2 = strcmp(alphacode + 4,alphaCode);
    if ((iVar2 != 0) && (iVar2 = strcmp(alphacode + 7,alphaCode), iVar2 != 0)) {
      foundError();
      printf("*** ERROR *** getTerritoryIsoName(%d)=\"%s\" which does not equal or contain \"%s\"\n"
             ,(ulong)(uint)territory,alphacode + 4,alphaCode);
    }
  }
  iVar2._0_1_ = nam[0];
  iVar2._1_1_ = nam[1];
  iVar2._2_1_ = nam[2];
  iVar2._3_1_ = nam[3];
  return iVar2;
}

Assistant:

static int testTerritory(const char *alphaCode, enum Territory territory,
                         int isAlias, int needsParent, enum Territory tcParent) {
    int nrTests = 0;
    char nam[MAX_ISOCODE_ASCII_LEN + 1];
    unsigned int i;
    for (i = 0; i <= strlen(alphaCode); i++) {
        char alphacode[MAX_ISOCODE_ASCII_LEN + 1];
        int tn;
        strcpy(alphacode, alphaCode);
        if (!needsParent && (i == 0)) {
            tn = getTerritoryCode(alphacode, TERRITORY_NONE);
            ++nrTests;
            if (tn != territory) {
                foundError();
                printf("*** ERROR *** getTerritoryCode('%s')=%d but expected %d (%s)\n",
                       alphacode, tn, territory, getTerritoryIsoName(nam, territory, 0));
            }
        }
        alphacode[i] = (char) tolower(alphacode[i]);
        tn = getTerritoryCode(alphacode, tcParent);
        ++nrTests;
        if (tn != territory) {
            foundError();
            printf("*** ERROR *** getTerritoryCode('%s',%s)=%d but expected %d\n", alphacode,
                   tcParent ? getTerritoryIsoName(nam, tcParent, 0) : "", tn, territory);
        }
    }

    if ((tcParent > _TERRITORY_MIN) && !isAlias) {
        getTerritoryIsoName(nam, territory, 0);
        ++nrTests;
        // every non-alias either equals nam, or is the state in nam
        if ((strcmp(nam, alphaCode) != 0) && (strcmp(nam + 3, alphaCode) != 0)) {
            foundError();
            printf("*** ERROR *** getTerritoryIsoName(%d)=\"%s\" which does not equal or contain \"%s\"\n",
                   territory, nam, alphaCode);
        }
    }
    return nrTests;
}